

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_0::FakeFileReader::~FakeFileReader(FakeFileReader *this)

{
  FakeFileReader *this_local;
  
  kj::Own<const_kj::Directory,_std::nullptr_t>::~Own(&this->current);
  kj::Path::~Path(&this->cwd);
  kj::Own<const_kj::Directory,_std::nullptr_t>::~Own(&this->root);
  return;
}

Assistant:

void add(kj::StringPtr name, kj::StringPtr content) {
    root->openFile(cwd.evalNative(name), kj::WriteMode::CREATE | kj::WriteMode::CREATE_PARENT)
        ->writeAll(content);
  }